

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pz81.hpp
# Opt level: O2

void ExchCXX::kernel_traits<ExchCXX::BuiltinPZ81>::eval_exc_vxc_polar_impl
               (double rho_a,double rho_b,double *eps,double *vrho_a,double *vrho_b)

{
  uint uVar1;
  double __x;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  ulong uVar11;
  undefined1 auVar10 [16];
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  double dVar19;
  undefined1 auVar18 [16];
  double dVar20;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar28;
  undefined1 auVar29 [16];
  undefined8 local_e8;
  
  __x = rho_a + rho_b;
  dVar2 = cbrt(__x);
  dVar2 = 1.0 / dVar2;
  dVar3 = dVar2 * 2.519842099789747 * 0.9847450218426962;
  if (dVar3 < 0.0) {
    dVar4 = sqrt(dVar3);
  }
  else {
    dVar4 = SQRT(dVar3);
  }
  dVar5 = log(dVar3 * 0.25);
  dVar17 = dVar5 * dVar2 * 2.519842099789747;
  dVar19 = dVar2 * 1.720508027656199;
  dVar20 = dVar19 * 0.37657136280726433 * 0.25 + dVar4 * 1.3981 * 0.5 + 1.0;
  dVar22 = dVar19 * 0.4808460067404899 * 0.25 + dVar4 * 1.0529 * 0.5 + 1.0;
  auVar15._8_8_ = dVar22;
  auVar15._0_8_ = dVar20;
  auVar15 = divpd(_DAT_010028a0,auVar15);
  auVar24._0_8_ =
       (dVar17 * 0.0006893215152898874 * 0.25 + dVar5 * 0.01555 + -0.0269) -
       dVar19 * 0.0069227979374755595 * 0.25;
  auVar24._8_8_ =
       (dVar17 * 0.0019694900436853925 * 0.25 + dVar5 * 0.0311 + -0.048) -
       dVar19 * 0.016730095015565934 * 0.25;
  uVar1 = (uint)(1.0 <= dVar3 * 0.25);
  auVar9._0_8_ = CONCAT44((int)(uVar1 << 0x1f) >> 0x1f,(int)(uVar1 << 0x1f) >> 0x1f);
  auVar9._8_4_ = (int)(uVar1 << 0x1f) >> 0x1f;
  auVar9._12_4_ = (int)(uVar1 << 0x1f) >> 0x1f;
  auVar16._0_8_ = auVar15._0_8_ & auVar9._0_8_;
  uVar11 = auVar9._8_8_;
  auVar16._8_8_ = auVar15._8_8_ & uVar11;
  auVar16 = auVar16 | ~auVar9 & auVar24;
  dVar8 = auVar16._8_8_;
  dVar3 = 1.0 / __x;
  dVar12 = (rho_a - rho_b) * dVar3;
  dVar17 = dVar12 + 1.0;
  dVar19 = cbrt(1e-15);
  dVar6 = cbrt(dVar17);
  dVar12 = 1.0 - dVar12;
  dVar7 = cbrt(dVar12);
  dVar14 = (1.0 / (__x * __x)) * (rho_a - rho_b);
  dVar21 = dVar3 - dVar14;
  dVar13 = 0.0;
  if (1e-15 < dVar17) {
    dVar13 = dVar21 * dVar6 * 1.3333333333333333;
  }
  local_e8 = auVar16._0_8_;
  local_e8 = local_e8 - dVar8;
  dVar14 = -dVar3 - dVar14;
  dVar28 = 0.0;
  if (1e-15 < dVar17) {
    dVar28 = dVar6 * 1.3333333333333333 * dVar14;
  }
  auVar29._8_8_ = 0x3ff0000000000000;
  auVar29._0_8_ = dVar2;
  auVar26._8_4_ = SUB84(dVar4,0);
  auVar26._0_8_ = __x;
  auVar26._12_4_ = (int)((ulong)dVar4 >> 0x20);
  auVar29 = divpd(auVar29,auVar26);
  dVar2 = auVar29._0_8_ * 1.720508027656199;
  auVar25._0_8_ = dVar2 * -0.4808460067404899;
  auVar25._8_8_ = auVar29._8_8_ * 1.0529 * 1.4422495703074083 * dVar2;
  dVar5 = dVar5 * auVar29._0_8_ * 2.519842099789747;
  auVar26 = divpd(auVar25,_DAT_01002710);
  auVar27._8_8_ = dVar22 * dVar22;
  auVar27._0_8_ = dVar20 * dVar20;
  auVar27 = divpd(_DAT_01002920,auVar27);
  auVar23._0_8_ = dVar2 * 0.0028844991406148167;
  auVar23._8_8_ = dVar2 * 0.016730095015565934;
  auVar24 = divpd(auVar23,_DAT_01002710);
  auVar18._0_8_ = dVar5 * -0.0006893215152898874;
  auVar18._8_8_ = dVar5 * -0.0019694900436853925;
  auVar16 = divpd(auVar18,_DAT_01002710);
  auVar10._0_8_ = dVar3 * -0.01555;
  auVar10._8_8_ = dVar3 * -0.0311;
  auVar15 = divpd(auVar10,_DAT_01002400);
  dVar5 = (double)(~-(ulong)(dVar17 <= 1e-15) & (ulong)(dVar17 * dVar6) |
                  -(ulong)(dVar17 <= 1e-15) & (ulong)(dVar19 * 1e-15)) +
          (double)(-(ulong)(dVar12 <= 1e-15) & (ulong)(dVar19 * 1e-15) |
                  ~-(ulong)(dVar12 <= 1e-15) & (ulong)(dVar12 * dVar7)) + -2.0;
  dVar3 = (double)(~uVar11 & (ulong)(auVar24._8_8_ +
                                    ((auVar16._8_8_ + auVar15._8_8_) - auVar24._0_8_)) |
                  (ulong)(auVar27._8_8_ * (auVar26._0_8_ - auVar26._8_8_)) & uVar11);
  dVar4 = 0.0;
  if (1e-15 < dVar12) {
    dVar4 = -dVar21 * dVar7 * 1.3333333333333333;
  }
  dVar17 = 0.0;
  if (1e-15 < dVar12) {
    dVar17 = dVar7 * 1.3333333333333333 * -dVar14;
  }
  dVar8 = dVar8 + local_e8 * dVar5 * 1.9236610509315362;
  *eps = dVar8;
  dVar3 = dVar3 + ((double)(~auVar9._0_8_ &
                            (ulong)((dVar2 * 0.0069227979374755595) / 12.0 +
                                   ((auVar16._0_8_ + auVar15._0_8_) -
                                   (dVar2 * 0.0010095746992151858) / 12.0)) |
                           (ulong)(auVar27._0_8_ *
                                  ((auVar29._8_8_ * 1.3981 * -1.4422495703074083 * dVar2) / 12.0 -
                                  (dVar2 * 0.37657136280726433) / 12.0)) & auVar9._0_8_) - dVar3) *
                  dVar5 * 1.9236610509315362;
  *vrho_a = ((dVar13 + dVar4) * local_e8 * 1.9236610509315362 + dVar3) * __x + dVar8;
  *vrho_b = (dVar3 + local_e8 * (dVar28 + dVar17) * 1.9236610509315362) * __x + dVar8;
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_vxc_polar_impl( double rho_a, double rho_b, double& eps, double& vrho_a, double& vrho_b ) {

    (void)(eps);
    constexpr double t1 = constants::m_cbrt_3;
    constexpr double t3 = constants::m_cbrt_one_ov_pi;
    constexpr double t5 = constants::m_cbrt_4;
    constexpr double t87 = constants::m_cbrt_2;
    constexpr double t6 = t5 * t5;
    constexpr double t14 = gamma_0;
    constexpr double t15 = beta1_0;
    constexpr double t20 = beta2_0 * t1;
    constexpr double t21 = t3 * t6;
    constexpr double t28 = a_0;
    constexpr double t33 = c_0 * t1;
    constexpr double t34 = t33 * t3;
    constexpr double t39 = d_0 * t1;
    constexpr double t44 = gamma_1;
    constexpr double t45 = beta1_1;
    constexpr double t49 = beta2_1 * t1;
    constexpr double t55 = a_1;
    constexpr double t59 = c_1 * t1;
    constexpr double t60 = t59 * t3;
    constexpr double t64 = d_1 * t1;


    const double t7 = rho_a + rho_b;
    const double t8 = safe_math::cbrt( t7 );
    const double t9 = 0.1e1 / t8;
    const double t10 = t6 * t9;
    const double t11 = t1 * t3 * t10;
    const double t12 = t11 / 0.4e1;
    const double t13 = 0.1e1 <= t12;
    const double t16 = safe_math::sqrt( t11 );
    const double t22 = t21 * t9;
    const double t25 = 0.1e1 + t15 * t16 / 0.2e1 + t20 * t22 / 0.4e1;
    const double t29 = safe_math::log( t12 );
    const double t35 = t10 * t29;
    const double t43 = piecewise_functor_3( t13, t14 / t25, t28 * t29 + b_0 + t34 * t35 / 0.4e1 + t39 * t22 / 0.4e1 );
    const double t52 = 0.1e1 + t45 * t16 / 0.2e1 + t49 * t22 / 0.4e1;
    const double t68 = piecewise_functor_3( t13, t44 / t52, t55 * t29 + b_1 + t60 * t35 / 0.4e1 + t64 * t22 / 0.4e1 );
    const double t69 = t68 - t43;
    const double t70 = rho_a - rho_b;
    const double t71 = 0.1e1 / t7;
    const double t72 = t70 * t71;
    const double t73 = 0.1e1 + t72;
    const double t74 = t73 <= zeta_tol;
    const double t75 = safe_math::cbrt( zeta_tol );
    const double t76 = t75 * zeta_tol;
    const double t77 = safe_math::cbrt( t73 );
    const double t79 = piecewise_functor_3( t74, t76, t77 * t73 );
    const double t80 = 0.1e1 - t72;
    const double t81 = t80 <= zeta_tol;
    const double t82 = safe_math::cbrt( t80 );
    const double t84 = piecewise_functor_3( t81, t76, t82 * t80 );
    const double t85 = t79 + t84 - 0.2e1;
    const double t90 = 0.1e1 / ( 0.2e1 * t87 - 0.2e1 );
    const double t91 = t69 * t85 * t90;
    const double t92 = t25 * t25;
    const double t94 = t14 / t92;
    const double t95 = 0.1e1 / t16;
    const double t97 = t15 * t95 * t1;
    const double t99 = 0.1e1 / t8 / t7;
    const double t100 = t21 * t99;
    const double t104 = -t20 * t100 / 0.12e2 - t97 * t100 / 0.12e2;
    const double t109 = t6 * t99 * t29;
    const double t117 = piecewise_functor_3( t13, -t94 * t104, -t28 * t71 / 0.3e1 - t34 * t109 / 0.12e2 - t33 * t100 / 0.12e2 - t39 * t100 / 0.12e2 );
    const double t118 = t52 * t52;
    const double t120 = t44 / t118;
    const double t122 = t45 * t95 * t1;
    const double t126 = -t122 * t100 / 0.12e2 - t49 * t100 / 0.12e2;
    const double t137 = piecewise_functor_3( t13, -t120 * t126, -t55 * t71 / 0.3e1 - t60 * t109 / 0.12e2 - t59 * t100 / 0.12e2 - t64 * t100 / 0.12e2 );
    const double t138 = t137 - t117;
    const double t140 = t138 * t85 * t90;
    const double t141 = t7 * t7;
    const double t142 = 0.1e1 / t141;
    const double t143 = t70 * t142;
    const double t144 = t71 - t143;
    const double t147 = piecewise_functor_3( t74, 0.0, 0.4e1 / 0.3e1 * t77 * t144 );
    const double t148 = -t144;
    const double t151 = piecewise_functor_3( t81, 0.0, 0.4e1 / 0.3e1 * t82 * t148 );
    const double t152 = t147 + t151;
    const double t154 = t69 * t152 * t90;
    const double t157 = -t71 - t143;
    const double t160 = piecewise_functor_3( t74, 0.0, 0.4e1 / 0.3e1 * t77 * t157 );
    const double t161 = -t157;
    const double t164 = piecewise_functor_3( t81, 0.0, 0.4e1 / 0.3e1 * t82 * t161 );
    const double t165 = t160 + t164;
    const double t167 = t69 * t165 * t90;


    eps = t43 + t91;
    vrho_a = t43 + t91 + t7 * ( t117 + t140 + t154 );
    vrho_b = t43 + t91 + t7 * ( t117 + t140 + t167 );

  }